

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void wasm_val_delete(wasm_val_t *val)

{
  wasm_ref_t *this;
  bool bVar1;
  wasm_val_t *val_local;
  
  if (val == (wasm_val_t *)0x0) {
    __assert_fail("val",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x23a,"void wasm_val_delete(wasm_val_t *)");
  }
  bVar1 = wasm_valkind_is_ref(val->kind);
  if (bVar1) {
    this = (val->of).ref;
    if (this != (wasm_ref_t *)0x0) {
      wasm_ref_t::~wasm_ref_t(this);
      operator_delete(this,0x18);
    }
    (val->of).i64 = 0;
  }
  return;
}

Assistant:

void wasm_val_delete(own wasm_val_t* val) {
  assert(val);
  if (wasm_valkind_is_ref(val->kind)) {
    delete val->of.ref;
    val->of.ref = nullptr;
  }
}